

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-defs.cpp
# Opt level: O3

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::addData
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,undefined8 param_3,
          undefined8 param_4,undefined4 *mem,uint param_6,undefined8 offset,char param_8)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  Module *pMVar4;
  pointer puVar5;
  __uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> _Var6;
  pointer puVar7;
  Memory *pMVar8;
  _Head_base<0UL,_wasm::DataSegment_*,_false> _Var9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  string local_70;
  Err local_50;
  
  pMVar4 = this->wasm;
  uVar3 = this->index;
  puVar5 = (pMVar4->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var6._M_t.super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
  super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
       puVar5[uVar3]._M_t.
       super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t;
  if (param_8 == '\x01') {
    *(undefined1 *)
     ((long)_Var6._M_t.
            super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
            super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 0x28) = 0;
    *(undefined8 *)
     ((long)_Var6._M_t.
            super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
            super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 0x30) = offset;
    if (mem == (undefined4 *)0x0) {
      puVar7 = (pMVar4->memories).
               super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pMVar4->memories).
          super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == puVar7) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"active data segment with no memory","");
        Lexer::err(&local_50,&this->in,(ulong)param_6,&local_70);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
        paVar2 = &local_50.msg.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50.msg._M_dataplus._M_p == paVar2) {
          *puVar1 = CONCAT71(local_50.msg.field_2._M_allocated_capacity._1_7_,
                             local_50.msg.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
               local_50.msg.field_2._8_8_;
        }
        else {
          *(pointer *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_50.msg._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
               CONCAT71(local_50.msg.field_2._M_allocated_capacity._1_7_,
                        local_50.msg.field_2._M_local_buf[0]);
        }
        *(size_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
             local_50.msg._M_string_length;
        local_50.msg._M_string_length = 0;
        local_50.msg.field_2._M_local_buf[0] = '\0';
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == &local_70.field_2) {
          return __return_storage_ptr__;
        }
        local_50.msg._M_dataplus._M_p = (pointer)paVar2;
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        return __return_storage_ptr__;
      }
      pMVar8 = (puVar7->_M_t).
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
               super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      _Var9._M_head_impl =
           *(DataSegment **)
            &puVar5[uVar3]._M_t.
             super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t;
      uVar10 = *(undefined4 *)&(pMVar8->super_Importable).super_Named;
      uVar11 = *(undefined4 *)((long)&(pMVar8->super_Importable).super_Named + 4);
      uVar12 = *(undefined4 *)((long)&(pMVar8->super_Importable).super_Named + 8);
      uVar13 = *(undefined4 *)((long)&(pMVar8->super_Importable).super_Named + 0xc);
    }
    else {
      _Var9._M_head_impl =
           *(DataSegment **)
            &puVar5[uVar3]._M_t.
             super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t;
      uVar10 = *mem;
      uVar11 = mem[1];
      uVar12 = mem[2];
      uVar13 = mem[3];
    }
    *(undefined4 *)&(_Var9._M_head_impl)->memory = uVar10;
    *(undefined4 *)((long)&(_Var9._M_head_impl)->memory + 4) = uVar11;
    *(undefined4 *)((long)&(_Var9._M_head_impl)->memory + 8) = uVar12;
    *(undefined4 *)((long)&(_Var9._M_head_impl)->memory + 0xc) = uVar13;
  }
  else {
    *(undefined1 *)
     ((long)_Var6._M_t.
            super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
            super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 0x28) = 1;
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<> ParseDefsCtx::addData(
  Name, Name* mem, std::optional<ExprT> offset, DataStringT, Index pos) {
  auto& d = wasm.dataSegments[index];
  if (offset) {
    d->isPassive = false;
    d->offset = *offset;
    if (mem) {
      d->memory = *mem;
    } else if (wasm.memories.size() > 0) {
      d->memory = wasm.memories[0]->name;
    } else {
      return in.err(pos, "active data segment with no memory");
    }
  } else {
    d->isPassive = true;
  }
  return Ok{};
}